

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

void __thiscall duckdb::Linenoise::EditDeletePrevWord(Linenoise *this)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  Linenoise *in_RDI;
  size_t diff;
  size_t old_pos;
  byte local_22;
  bool local_21;
  
  sVar1 = in_RDI->pos;
  while( true ) {
    local_21 = false;
    if (in_RDI->pos != 0) {
      local_21 = IsSpace(in_RDI->buf[in_RDI->pos - 1]);
    }
    if (local_21 == false) break;
    in_RDI->pos = in_RDI->pos - 1;
  }
  while( true ) {
    local_22 = 0;
    if (in_RDI->pos != 0) {
      bVar3 = IsSpace(in_RDI->buf[in_RDI->pos - 1]);
      local_22 = bVar3 ^ 0xff;
    }
    if ((local_22 & 1) == 0) break;
    in_RDI->pos = in_RDI->pos - 1;
  }
  sVar2 = in_RDI->pos;
  memmove(in_RDI->buf + in_RDI->pos,in_RDI->buf + sVar1,(in_RDI->len - sVar1) + 1);
  in_RDI->len = in_RDI->len - (sVar1 - sVar2);
  RefreshLine(in_RDI);
  return;
}

Assistant:

void Linenoise::EditDeletePrevWord() {
	size_t old_pos = pos;
	size_t diff;

	while (pos > 0 && IsSpace(buf[pos - 1])) {
		pos--;
	}
	while (pos > 0 && !IsSpace(buf[pos - 1])) {
		pos--;
	}
	diff = old_pos - pos;
	memmove(buf + pos, buf + old_pos, len - old_pos + 1);
	len -= diff;
	RefreshLine();
}